

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

int ucnv_compareNames_63(char *name1,char *name2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  
  bVar10 = 0;
  bVar2 = 0;
LAB_001c799d:
  do {
    bVar5 = bVar2;
    pbVar7 = (byte *)name1 + 1;
    bVar1 = *name1;
    uVar8 = (uint)bVar1;
    name1 = (char *)pbVar7;
    pbVar6 = (byte *)name2;
    bVar3 = bVar10;
    if ((ulong)bVar1 == 0) {
      uVar8 = 0;
    }
    else {
      if ((char)bVar1 < '\0') {
        bVar2 = 0;
        goto LAB_001c799d;
      }
      bVar2 = ""[bVar1];
      if (bVar2 == 0) goto LAB_001c799d;
      if (bVar2 == 1) {
        if (bVar5 != 0) {
LAB_001c79eb:
          bVar5 = 1;
          goto LAB_001c79f7;
        }
        bVar2 = bVar1;
        if (-1 < (long)(char)*pbVar7) {
          bVar5 = 0;
          bVar2 = bVar5;
          if (1 < ""[(char)*pbVar7] - 1) goto LAB_001c79f7;
          goto LAB_001c799d;
        }
      }
      else if (bVar2 == 2) goto LAB_001c79eb;
      uVar8 = (uint)bVar2;
      bVar5 = 0;
    }
LAB_001c79f7:
    do {
      do {
        while( true ) {
          bVar10 = bVar3;
          name2 = (char *)(pbVar6 + 1);
          bVar2 = *pbVar6;
          uVar9 = (uint)bVar2;
          iVar4 = 0;
          if ((ulong)bVar2 == 0) {
            uVar9 = 0;
            goto LAB_001c7a5d;
          }
          pbVar6 = (byte *)name2;
          if (-1 < (char)bVar2) break;
          bVar3 = 0;
        }
        bVar3 = ""[bVar2];
      } while (bVar3 == 0);
      if (bVar3 != 1) {
        if (bVar3 == 2) {
LAB_001c7a52:
          bVar10 = 1;
        }
        else {
LAB_001c7a5a:
          uVar9 = (uint)bVar3;
          bVar10 = 0;
        }
        break;
      }
      if (bVar10 != 0) goto LAB_001c7a52;
      bVar3 = bVar2;
      if ((long)*name2 < 0) goto LAB_001c7a5a;
      bVar10 = 0;
      bVar3 = 0;
    } while (""[*name2] - 1 < 2);
LAB_001c7a5d:
    if (((char)uVar9 == '\0' && (char)uVar8 == '\0') ||
       (iVar4 = uVar8 - uVar9, bVar2 = bVar5, iVar4 != 0)) {
      return iVar4;
    }
  } while( true );
}

Assistant:

U_CAPI int U_EXPORT2
ucnv_compareNames(const char *name1, const char *name2) {
    int rc;
    uint8_t type, nextType;
    char c1, c2;
    UBool afterDigit1 = FALSE, afterDigit2 = FALSE;

    for (;;) {
        while ((c1 = *name1++) != 0) {
            type = GET_CHAR_TYPE(c1);
            switch (type) {
            case UIGNORE:
                afterDigit1 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit1) {
                    nextType = GET_CHAR_TYPE(*name1);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit1 = TRUE;
                break;
            default:
                c1 = (char)type; /* lowercased letter */
                afterDigit1 = FALSE;
                break;
            }
            break; /* deliver c1 */
        }
        while ((c2 = *name2++) != 0) {
            type = GET_CHAR_TYPE(c2);
            switch (type) {
            case UIGNORE:
                afterDigit2 = FALSE;
                continue; /* ignore all but letters and digits */
            case ZERO:
                if (!afterDigit2) {
                    nextType = GET_CHAR_TYPE(*name2);
                    if (nextType == ZERO || nextType == NONZERO) {
                        continue; /* ignore leading zero before another digit */
                    }
                }
                break;
            case NONZERO:
                afterDigit2 = TRUE;
                break;
            default:
                c2 = (char)type; /* lowercased letter */
                afterDigit2 = FALSE;
                break;
            }
            break; /* deliver c2 */
        }

        /* If we reach the ends of both strings then they match */
        if ((c1|c2)==0) {
            return 0;
        }

        /* Case-insensitive comparison */
        rc = (int)(unsigned char)c1 - (int)(unsigned char)c2;
        if (rc != 0) {
            return rc;
        }
    }
}